

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

path * AbsPathForConfigVal(path *__return_storage_ptr__,ArgsManager *args,path *path,
                          bool net_specific)

{
  char cVar1;
  long in_FS_OFFSET;
  path local_50;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = std::filesystem::__cxx11::path::has_root_directory();
  if (cVar1 == '\0') {
    if (net_specific) {
      ArgsManager::GetDataDirNet((path *)&local_50,args);
    }
    else {
      ArgsManager::GetDataDirBase((path *)&local_50,args);
    }
    fsbridge::AbsPathJoin(__return_storage_ptr__,(path *)&local_50,path);
    std::filesystem::__cxx11::path::~path(&local_50);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_00363a3e;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
LAB_00363a3e:
      __stack_chk_fail();
    }
    std::filesystem::__cxx11::path::path(&__return_storage_ptr__->super_path,&path->super_path);
  }
  return __return_storage_ptr__;
}

Assistant:

fs::path AbsPathForConfigVal(const ArgsManager& args, const fs::path& path, bool net_specific)
{
    if (path.is_absolute()) {
        return path;
    }
    return fsbridge::AbsPathJoin(net_specific ? args.GetDataDirNet() : args.GetDataDirBase(), path);
}